

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O3

void __thiscall
UnitTest::XmlTestReporter::AddFailure(XmlTestReporter *this,ostream *os,DeferredTestResult *result)

{
  int iVar1;
  pointer pcVar2;
  ostream *poVar3;
  pointer ppVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string escapedMessage;
  string message;
  string local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,">",1);
  ppVar4 = (result->failures).
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar4 != (result->failures).
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      paVar5 = &local_1a8[0].field_2;
      pcVar2 = (ppVar4->second)._M_dataplus._M_p;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,pcVar2,pcVar2 + (ppVar4->second)._M_string_length);
      local_1a8[0].field_2._M_local_buf[4] = ';';
      local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x706d6126;
      local_1a8[0]._M_string_length = 5;
      local_1a8[0].field_2._M_local_buf[5] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar5;
      anon_unknown.dwarf_942c7::ReplaceChar(&local_1e8,'&',local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT17(local_1a8[0].field_2._M_local_buf[7],
                                 CONCAT16(local_1a8[0].field_2._M_local_buf[6],
                                          CONCAT15(local_1a8[0].field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8[0].field_2._M_local_buf[4],
                                                            (undefined4)
                                                            local_1a8[0].field_2.
                                                            _M_allocated_capacity)))) + 1);
      }
      local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x3b746c26;
      local_1a8[0]._M_string_length = 4;
      local_1a8[0].field_2._M_local_buf[4] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar5;
      anon_unknown.dwarf_942c7::ReplaceChar(&local_1e8,'<',local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT17(local_1a8[0].field_2._M_local_buf[7],
                                 CONCAT16(local_1a8[0].field_2._M_local_buf[6],
                                          CONCAT15(local_1a8[0].field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8[0].field_2._M_local_buf[4],
                                                            (undefined4)
                                                            local_1a8[0].field_2.
                                                            _M_allocated_capacity)))) + 1);
      }
      local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x3b746726;
      local_1a8[0]._M_string_length = 4;
      local_1a8[0].field_2._M_local_buf[4] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar5;
      anon_unknown.dwarf_942c7::ReplaceChar(&local_1e8,'>',local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT17(local_1a8[0].field_2._M_local_buf[7],
                                 CONCAT16(local_1a8[0].field_2._M_local_buf[6],
                                          CONCAT15(local_1a8[0].field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8[0].field_2._M_local_buf[4],
                                                            (undefined4)
                                                            local_1a8[0].field_2.
                                                            _M_allocated_capacity)))) + 1);
      }
      local_1a8[0].field_2._M_local_buf[4] = 's';
      local_1a8[0].field_2._M_local_buf[5] = ';';
      local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x6f706126;
      local_1a8[0]._M_string_length = 6;
      local_1a8[0].field_2._M_local_buf[6] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar5;
      anon_unknown.dwarf_942c7::ReplaceChar(&local_1e8,'\'',local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT17(local_1a8[0].field_2._M_local_buf[7],
                                 CONCAT16(local_1a8[0].field_2._M_local_buf[6],
                                          CONCAT15(local_1a8[0].field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8[0].field_2._M_local_buf[4],
                                                            (undefined4)
                                                            local_1a8[0].field_2.
                                                            _M_allocated_capacity)))) + 1);
      }
      local_1a8[0].field_2._M_local_buf[4] = 't';
      local_1a8[0].field_2._M_local_buf[5] = ';';
      local_1a8[0].field_2._M_allocated_capacity._0_4_ = 0x6f757126;
      local_1a8[0]._M_string_length = 6;
      local_1a8[0].field_2._M_local_buf[6] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar5;
      anon_unknown.dwarf_942c7::ReplaceChar(&local_1e8,'\"',local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar5) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT17(local_1a8[0].field_2._M_local_buf[7],
                                 CONCAT16(local_1a8[0].field_2._M_local_buf[6],
                                          CONCAT15(local_1a8[0].field_2._M_local_buf[5],
                                                   CONCAT14(local_1a8[0].field_2._M_local_buf[4],
                                                            (undefined4)
                                                            local_1a8[0].field_2.
                                                            _M_allocated_capacity)))) + 1);
      }
      iVar1 = ppVar4->first;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(result->failureFile)._M_dataplus._M_p,
                          (result->failureFile)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") : ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(os,"<failure",8);
      std::__ostream_insert<char,std::char_traits<char>>(os," message=\"",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1c8,local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/>",2);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != (result->failures).
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void XmlTestReporter::AddFailure(std::ostream& os, DeferredTestResult const& result)
{
    os << ">"; // close <test> element

    for (DeferredTestResult::FailureVec::const_iterator it = result.failures.begin(); 
         it != result.failures.end(); 
         ++it)
    {
        string const escapedMessage = XmlEscape(it->second);
        string const message = BuildFailureMessage(result.failureFile, it->first, escapedMessage);

        os << "<failure" << " message=\"" << message << "\"" << "/>";
    }
}